

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

time_t __thiscall ON_XMLVariant::AsTime(ON_XMLVariant *this)

{
  ON_XMLVariantPrivate *pOVar1;
  int iVar2;
  wchar_t *__nptr;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  tm local_68;
  
  pOVar1 = this->_private;
  if (pOVar1->_type == Time) {
    dVar9 = (pOVar1->field_2)._double_val;
  }
  else if (pOVar1->_type == String) {
    iVar2 = ON_wString::Length(&pOVar1->_string_val);
    dVar9 = -NAN;
    if (iVar2 == 0x13) {
      __nptr = ON_wString::operator_cast_to_wchar_t_(&pOVar1->_string_val);
      if ((((__nptr[4] == L'.') && (__nptr[7] == L'.')) && (__nptr[10] == L'_')) &&
         ((__nptr[0xd] == L':' && (__nptr[0x10] == L':')))) {
        lVar3 = wcstol(__nptr,(wchar_t **)0x0,10);
        lVar4 = wcstol(__nptr + 5,(wchar_t **)0x0,10);
        lVar5 = wcstol(__nptr + 8,(wchar_t **)0x0,10);
        lVar6 = wcstol(__nptr + 0xb,(wchar_t **)0x0,10);
        lVar7 = wcstol(__nptr + 0xe,(wchar_t **)0x0,10);
        lVar8 = wcstol(__nptr + 0x11,(wchar_t **)0x0,10);
        if ((((0xfffffff3 < (int)lVar4 - 0xdU && 0xfffffda6 < (int)lVar3 - 0x9c5U) &&
             ((local_68.tm_mday = (int)lVar5, local_68.tm_mday - 1U < 0x1f &&
              (local_68.tm_hour = (int)lVar6, (uint)local_68.tm_hour < 0x18)))) &&
            (local_68.tm_min = (int)lVar7, (uint)local_68.tm_min < 0x3c)) &&
           (local_68.tm_sec = (int)lVar8, (uint)local_68.tm_sec < 0x3c)) {
          local_68.tm_wday = 0;
          local_68.tm_yday = 0;
          local_68.tm_gmtoff = 0;
          local_68.tm_zone = (char *)0x0;
          local_68.tm_year = (int)lVar3 + -0x76c;
          local_68.tm_mon = (int)lVar4 + -1;
          local_68.tm_isdst = -1;
          local_68._36_4_ = 0;
          dVar9 = (double)mktime(&local_68);
        }
      }
    }
  }
  else {
    dVar9 = 0.0;
  }
  return (time_t)dVar9;
}

Assistant:

time_t ON_XMLVariant::AsTime(void) const
{
  switch (_private->_type)
  {
  case Types::String:
    return TimeFromString(_private->_string_val);

  case Types::Time:
    return _private->_time_val;
          
  default: return 0;
  }
}